

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O2

void __thiscall
program_options::command_line_parser::finish_option
          (command_line_parser *this,option *opt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *other_tokens,
          vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
          *style_parsers)

{
  style_t sVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pfVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  option_description *poVar8;
  pointer pbVar9;
  invalid_command_line_syntax *piVar10;
  unknown_option *this_00;
  int iVar11;
  ulong uVar12;
  pointer __value;
  uint i;
  bool bVar13;
  allocator<char> local_f2;
  allocator<char> local_f1;
  undefined1 local_f0 [56];
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  followed_option;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  string original_token_for_exceptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  next_token;
  
  if ((opt->string_key)._M_string_length != 0) {
    local_f0._48_8_ = other_tokens;
    std::__cxx11::string::string((string *)&original_token_for_exceptions,(string *)opt);
    if ((opt->original_tokens).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (opt->original_tokens).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::_M_assign((string *)&original_token_for_exceptions);
    }
    sVar1 = this->m_style;
    poVar8 = options_description::find_nothrow
                       (this->m_options_description,&opt->string_key,(bool)((byte)(sVar1 >> 9) & 1),
                        (bool)((byte)(sVar1 >> 10) & 1),(bool)((byte)(sVar1 >> 0xb) & 1));
    if (poVar8 == (option_description *)0x0) {
      if (this->m_allow_unregistered != true) {
        local_f0._32_8_ = this;
        local_f0._40_8_ = opt;
        this_00 = (unknown_option *)__cxa_allocate_exception(0xb8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f0,"",(allocator<char> *)&local_98);
        unknown_option::unknown_option(this_00,(string *)local_f0);
        __cxa_throw(this_00,&unknown_option::typeinfo,
                    error_with_option_name::~error_with_option_name);
      }
      opt->unregistered = true;
    }
    else {
      local_f0._32_8_ = this;
      local_f0._40_8_ = opt;
      option_description::key(poVar8,&opt->string_key);
      std::__cxx11::string::_M_assign((string *)opt);
      option_description::semantic((option_description *)local_f0);
      uVar6 = (**(code **)(*(long *)local_f0._0_8_ + 0x18))();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
      option_description::semantic((option_description *)local_f0);
      iVar7 = (**(code **)(*(long *)local_f0._0_8_ + 0x20))();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
      pbVar2 = (opt->value).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (opt->value).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar12 = (long)pbVar3 - (long)pbVar2 >> 5;
      __value = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_f0._48_8_)->_M_impl).super__Vector_impl_data._M_start;
      pbVar9 = *(pointer *)(local_f0._48_8_ + 8);
      iVar11 = (int)uVar12;
      if ((uint)((int)((ulong)((long)pbVar9 - (long)__value) >> 5) + iVar11) < uVar6) {
        piVar10 = (invalid_command_line_syntax *)__cxa_allocate_exception(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f0,"",(allocator<char> *)&followed_option);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"",(allocator<char> *)&next_token);
        invalid_command_line_syntax::invalid_command_line_syntax
                  (piVar10,missing_parameter,(string *)local_f0,&local_98,0);
        __cxa_throw(piVar10,&invalid_command_line_syntax::typeinfo,
                    error_with_option_name::~error_with_option_name);
      }
      if (iVar7 == 0 && pbVar2 != pbVar3) {
        piVar10 = (invalid_command_line_syntax *)__cxa_allocate_exception(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f0,"",(allocator<char> *)&followed_option);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"",(allocator<char> *)&next_token);
        invalid_command_line_syntax::invalid_command_line_syntax
                  (piVar10,extra_parameter,(string *)local_f0,&local_98,0);
        __cxa_throw(piVar10,&invalid_command_line_syntax::typeinfo,
                    error_with_option_name::~error_with_option_name);
      }
      iVar7 = 0;
      if (uVar12 <= uVar6) {
        iVar7 = uVar6 - iVar11;
      }
      local_78 = &opt->original_tokens;
      local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&opt->value;
      while ((__value != pbVar9 && (bVar13 = iVar7 != 0, iVar7 = iVar7 + -1, bVar13))) {
        followed_option.
        super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        followed_option.
        super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        followed_option.
        super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&next_token,1,__value,(allocator_type *)local_f0);
        uVar12 = 0;
        while (uVar5 = local_f0._48_8_,
              followed_option.
              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              followed_option.
              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
          pfVar4 = (style_parsers->
                   super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(style_parsers->
                            super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pfVar4 >> 5) <=
              uVar12) goto LAB_001572fe;
          std::
          function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
          ::operator()((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                        *)local_f0,pfVar4 + uVar12,&next_token);
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::_M_move_assign(&followed_option,(allocator_type *)local_f0);
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                     *)local_f0);
          uVar12 = (ulong)((int)uVar12 + 1);
        }
        std::__cxx11::string::_M_assign((string *)&original_token_for_exceptions);
        sVar1 = *(style_t *)(local_f0._32_8_ + 0x28);
        poVar8 = options_description::find_nothrow
                           (*(options_description **)(local_f0._32_8_ + 0x18),
                            (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)uVar5)->_M_impl).super__Vector_impl_data._M_start,
                            (bool)((byte)(sVar1 >> 9) & 1),(bool)((byte)(sVar1 >> 10) & 1),
                            (bool)((byte)(sVar1 >> 0xb) & 1));
        if (poVar8 != (option_description *)0x0) {
          piVar10 = (invalid_command_line_syntax *)__cxa_allocate_exception(0xc0);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,"",&local_f1);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_f2);
          invalid_command_line_syntax::invalid_command_line_syntax
                    (piVar10,missing_parameter,(string *)local_f0,&local_98,0);
          __cxa_throw(piVar10,&invalid_command_line_syntax::typeinfo,
                      error_with_option_name::~error_with_option_name);
        }
LAB_001572fe:
        uVar5 = local_f0._48_8_;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_70._M_pi,
                    (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_f0._48_8_)->_M_impl).super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_78,(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)uVar5)->_M_impl).super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)uVar5,(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)uVar5)->_M_impl).super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&next_token);
        std::
        vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ::~vector(&followed_option);
        __value = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)uVar5)->_M_impl).super__Vector_impl_data._M_start;
        pbVar9 = *(pointer *)(uVar5 + 8);
      }
    }
    std::__cxx11::string::~string((string *)&original_token_for_exceptions);
  }
  return;
}

Assistant:

void command_line_parser::finish_option(option& opt,
    std::vector<std::string>& other_tokens,
    const std::vector<style_parser>& style_parsers)
{
    if (opt.string_key.empty())
        return;

    //
    // Be defensive:
    // will have no original token if option created by handle_additional_parser()
    std::string original_token_for_exceptions = opt.string_key;
    if (opt.original_tokens.size())
        original_token_for_exceptions = opt.original_tokens[0];

    try
    {
        // First check that the option is valid, and get its description.
        const option_description* xd = m_options_description->find_nothrow(
            opt.string_key,
            is_style_active(command_line_style::allow_guessing),
            is_style_active(command_line_style::long_case_insensitive),
            is_style_active(command_line_style::short_case_insensitive));

        if (!xd)
        {
            if (m_allow_unregistered) {
                opt.unregistered = true;
                return;
            } else {
                throw unknown_option();
            }
        }
        const option_description& d = *xd;

        // Canonize the name
        opt.string_key = d.key(opt.string_key);

        // We check that the min/max number of tokens for the option
        // agrees with the number of tokens we have. The 'adjacent_value'
        // (the value in --foo=1) counts as a separate token, and if present
        // must be consumed. The following tokens on the command line may be
        // left unconsumed.
        unsigned min_tokens = d.semantic()->min_tokens();
        unsigned max_tokens = d.semantic()->max_tokens();

        unsigned present_tokens = static_cast<unsigned>(opt.value.size() + other_tokens.size());

        if (present_tokens >= min_tokens)
        {
            if (!opt.value.empty() && max_tokens == 0)
            {
                throw invalid_command_line_syntax(invalid_command_line_syntax::extra_parameter);
            }

            // Grab min_tokens values from other_tokens, but only if those tokens
            // are not recognized as options themselves.
            if (opt.value.size() <= min_tokens)
            {
                min_tokens -= static_cast<unsigned>(opt.value.size());
            }
            else
            {
                min_tokens = 0;
            }

            // Everything's OK, move the values to the result.
            for(;!other_tokens.empty() && min_tokens--; )
            {
                // check if extra parameter looks like a known option
                // we use style parsers to check if it is syntactically an option,
                // additionally we check if an option_description exists
                std::vector<option> followed_option;
                std::vector<std::string> next_token(1, other_tokens[0]);
                for (unsigned i = 0; followed_option.empty() && i < style_parsers.size(); ++i)
                {
                    followed_option = style_parsers[i](next_token);
                }
                if (!followed_option.empty())
                {
                    original_token_for_exceptions = other_tokens[0];
                    const option_description* od = m_options_description->find_nothrow(other_tokens[0],
                            is_style_active(command_line_style::allow_guessing),
                            is_style_active(command_line_style::long_case_insensitive),
                            is_style_active(command_line_style::short_case_insensitive));
                    if (od) {
                        throw invalid_command_line_syntax(invalid_command_line_syntax::missing_parameter);
                    }
                }
                opt.value.push_back(other_tokens[0]);
                opt.original_tokens.push_back(other_tokens[0]);
                other_tokens.erase(other_tokens.begin());
            }
        }
        else
        {
            throw invalid_command_line_syntax(invalid_command_line_syntax::missing_parameter);

        }
    }
    // use only original token for unknown_option / ambiguous_option since by definition
    //    they are unrecognised / unparsable
    catch(error_with_option_name& e)
    {
        // add context and rethrow
        e.add_context(opt.string_key, original_token_for_exceptions, get_canonical_option_prefix());
        throw;
    }

}